

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswDyn.c
# Opt level: O1

void Ssw_ManSweepTransferDyn(Ssw_Man_t *p)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  Aig_Man_t *pAVar5;
  int iVar6;
  long lVar7;
  
  pVVar4 = p->pAig->vCis;
  if (0 < pVVar4->nSize) {
    lVar7 = 0;
    do {
      pAVar1 = (Aig_Obj_t *)pVVar4->pArray[lVar7];
      pAVar2 = p->pNodeToFrames[(long)pAVar1->Id * (long)p->nFrames];
      if (pAVar2 == (Aig_Obj_t *)((ulong)p->pFrames->pConst1 ^ 1)) {
        Ssw_SmlObjAssignConst(p->pSml,pAVar1,0,0);
      }
      else {
        if (((ulong)pAVar2 & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObjFraig)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswDyn.c"
                        ,0xe2,"void Ssw_ManSweepTransferDyn(Ssw_Man_t *)");
        }
        if ((*(uint *)&pAVar2->field_0x18 & 7) != 2) {
          __assert_fail("Aig_ObjIsCi(pObjFraig)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswDyn.c"
                        ,0xe3,"void Ssw_ManSweepTransferDyn(Ssw_Man_t *)");
        }
        iVar6 = (pAVar2->field_0).CioId;
        if (((long)iVar6 < 0) || (p->vSimInfo->nSize <= iVar6)) {
LAB_0069d043:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        Ssw_SmlObjSetWord(p->pSml,pAVar1,*p->vSimInfo->pArray[iVar6],0,0);
      }
      lVar7 = lVar7 + 1;
      pVVar4 = p->pAig->vCis;
    } while (lVar7 < pVVar4->nSize);
  }
  iVar6 = 1;
  if (1 < p->nFrames) {
    do {
      pAVar5 = p->pAig;
      if (0 < pAVar5->nTruePis) {
        lVar7 = 0;
        do {
          if (pAVar5->vCis->nSize <= lVar7) goto LAB_0069d043;
          pAVar1 = (Aig_Obj_t *)pAVar5->vCis->pArray[lVar7];
          pAVar2 = p->pNodeToFrames[pAVar1->Id * p->nFrames + iVar6];
          if (((ulong)pAVar2 & 1) != 0) {
            __assert_fail("!Aig_IsComplement(pObjFraig)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswDyn.c"
                          ,0xed,"void Ssw_ManSweepTransferDyn(Ssw_Man_t *)");
          }
          if ((*(uint *)&pAVar2->field_0x18 & 7) != 2) {
            __assert_fail("Aig_ObjIsCi(pObjFraig)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswDyn.c"
                          ,0xee,"void Ssw_ManSweepTransferDyn(Ssw_Man_t *)");
          }
          iVar3 = (pAVar2->field_0).CioId;
          if (((long)iVar3 < 0) || (p->vSimInfo->nSize <= iVar3)) goto LAB_0069d043;
          Ssw_SmlObjSetWord(p->pSml,pAVar1,*p->vSimInfo->pArray[iVar3],0,iVar6);
          lVar7 = lVar7 + 1;
          pAVar5 = p->pAig;
        } while (lVar7 < pAVar5->nTruePis);
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < p->nFrames);
  }
  iVar3 = Ssw_SmlNumFrames(p->pSml);
  if (iVar6 < iVar3) {
    do {
      pAVar5 = p->pAig;
      if (0 < pAVar5->nTruePis) {
        lVar7 = 0;
        do {
          if (pAVar5->vCis->nSize <= lVar7) goto LAB_0069d043;
          Ssw_SmlAssignRandomFrame(p->pSml,(Aig_Obj_t *)pAVar5->vCis->pArray[lVar7],iVar6);
          lVar7 = lVar7 + 1;
          pAVar5 = p->pAig;
        } while (lVar7 < pAVar5->nTruePis);
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 != iVar3);
  }
  return;
}

Assistant:

void Ssw_ManSweepTransferDyn( Ssw_Man_t * p )
{
    Aig_Obj_t * pObj, * pObjFraig;
    unsigned * pInfo;
    int i, f, nFrames;

    // transfer simulation information
    Aig_ManForEachCi( p->pAig, pObj, i )
    {
        pObjFraig = Ssw_ObjFrame( p, pObj, 0 );
        if ( pObjFraig == Aig_ManConst0(p->pFrames) )
        {
            Ssw_SmlObjAssignConst( p->pSml, pObj, 0, 0 );
            continue;
        }
        assert( !Aig_IsComplement(pObjFraig) );
        assert( Aig_ObjIsCi(pObjFraig) );
        pInfo = (unsigned *)Vec_PtrEntry( p->vSimInfo, Aig_ObjCioId(pObjFraig) );
        Ssw_SmlObjSetWord( p->pSml, pObj, pInfo[0], 0, 0 );
    }
    // set random simulation info for the second frame
    for ( f = 1; f < p->nFrames; f++ )
    {
        Saig_ManForEachPi( p->pAig, pObj, i )
        {
            pObjFraig = Ssw_ObjFrame( p, pObj, f );
            assert( !Aig_IsComplement(pObjFraig) );
            assert( Aig_ObjIsCi(pObjFraig) );
            pInfo = (unsigned *)Vec_PtrEntry( p->vSimInfo, Aig_ObjCioId(pObjFraig) );
            Ssw_SmlObjSetWord( p->pSml, pObj, pInfo[0], 0, f );
        }
    }
    // create random info
    nFrames = Ssw_SmlNumFrames( p->pSml );
    for ( ; f < nFrames; f++ )
    {
        Saig_ManForEachPi( p->pAig, pObj, i )
            Ssw_SmlAssignRandomFrame( p->pSml, pObj, f );
    }
}